

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O2

int Gia_ManCombMarkUsed(Gia_Man_t *p)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  iVar7 = 0;
  while ((iVar7 < p->nObjs && (pGVar4 = Gia_ManObj(p,iVar7), pGVar4 != (Gia_Obj_t *)0x0))) {
    uVar1 = *(ulong *)pGVar4;
    uVar2 = (uint)uVar1;
    if ((~uVar2 & 0x1fffffff) == 0 || (int)uVar2 < 0) {
      uVar5 = 0;
    }
    else {
      uVar2 = Gia_ObjIsBuf(pGVar4);
      uVar5 = (ulong)((uVar2 ^ 1) << 0x1e);
    }
    *(ulong *)pGVar4 = uVar1 & 0xffffffffbfffffff | uVar5;
    iVar7 = iVar7 + 1;
  }
  iVar7 = 0;
  iVar6 = 0;
  if (p->nBufs == 0) {
    iVar7 = p->nObjs;
    iVar6 = 0;
  }
  while ((iVar7 < p->nObjs && (pGVar4 = Gia_ManObj(p,iVar7), pGVar4 != (Gia_Obj_t *)0x0))) {
    iVar3 = Gia_ObjIsBuf(pGVar4);
    if (iVar3 != 0) {
      iVar3 = Gia_ManCombMarkUsed_rec(p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff))
      ;
      iVar6 = iVar6 + iVar3;
    }
    iVar7 = iVar7 + 1;
  }
  iVar7 = 0;
  while( true ) {
    if (p->vCos->nSize <= iVar7) {
      return iVar6;
    }
    pGVar4 = Gia_ManCo(p,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar3 = Gia_ManCombMarkUsed_rec(p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
    iVar6 = iVar6 + iVar3;
    iVar7 = iVar7 + 1;
  }
  return iVar6;
}

Assistant:

int Gia_ManCombMarkUsed( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nNodes = 0;
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = Gia_ObjIsAnd(pObj) && !Gia_ObjIsBuf(pObj);
    Gia_ManForEachBuf( p, pObj, i )
        nNodes += Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        nNodes += Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin0(pObj) );
    return nNodes;
}